

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutils.h
# Opt level: O0

float approx_exp(float y)

{
  anon_union_4_2_f3146db3 container;
  float y_local;
  
  return (float)((int)(y * 12102203.0) + 0x3f7f127f);
}

Assistant:

static inline float approx_exp(float y) {
#define A ((1 << 23) / 0.69314718056f)  // (1 << 23) / ln(2)
#define B \
  127  // Offset for the exponent according to IEEE floating point standard.
#define C 60801  // Magic number controls the accuracy of approximation
  union {
    float as_float;
    int32_t as_int32;
  } container;
  container.as_int32 = ((int32_t)(y * A)) + ((B << 23) - C);
  return container.as_float;
#undef A
#undef B
#undef C
}